

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# identifier.c
# Opt level: O1

mpt_identifier * mpt_identifier_new(size_t len)

{
  ulong uVar1;
  int *piVar2;
  mpt_identifier *pmVar3;
  ulong __size;
  size_t __n;
  
  if (len < 0x10000) {
    __size = 0x20;
    if (len - 0x1d < 0xe0) {
      uVar1 = 0x20;
      do {
        __size = uVar1;
        uVar1 = __size * 2;
      } while (__size < len + 4);
    }
    pmVar3 = (mpt_identifier *)malloc(__size);
    if (pmVar3 != (mpt_identifier *)0x0) {
      __n = __size - 4;
      if (0xfb < __n) {
        __n = 0xfc;
      }
      pmVar3->_len = 0;
      pmVar3->_charset = '\0';
      pmVar3->_max = (uint8_t)__n;
      memset(pmVar3->_val,0,__n);
      return pmVar3;
    }
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
  }
  return (mpt_identifier *)0x0;
}

Assistant:

MPT_STRUCT(identifier) *mpt_identifier_new(size_t len)
{
	MPT_STRUCT(identifier) *id;
	size_t size = 4 * sizeof(void *);
	
	/* bad length constraint */
	if (len > UINT16_MAX) {
		errno = EINVAL;
		return 0;
	}
	/* non-default identifier size */
	len += MPT_IDENT_HSZE;
	if (len > size && len <= 0x100) {
		while (size < len) {
			size *= 2; /* (16,) 32, 64, 128, 256 */
		}
	}
	if (!(id = malloc(size))) {
		return 0;
	}
	mpt_identifier_init(id, size);
	return id;
}